

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<4>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  unsigned_long *ptr;
  int i;
  int index;
  
  for (index = 0; index < *field; index = index + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    ptr = RepeatedField<unsigned_long>::Get((RepeatedField<unsigned_long> *)field,index);
    OutputHelper<google::protobuf::internal::ArrayOutput,_4>::Serialize(ptr,output);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }